

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void rhash_sha3_update(sha3_ctx *ctx,uchar *msg,size_t size)

{
  ulong uVar1;
  ulong block_size_00;
  ulong uVar2;
  size_t local_58;
  uint64_t *local_40;
  uint64_t *aligned_message_block;
  size_t left;
  size_t block_size;
  size_t index;
  size_t size_local;
  uchar *msg_local;
  sha3_ctx *ctx_local;
  
  uVar1 = (ulong)ctx->rest;
  block_size_00 = (ulong)ctx->block_size;
  if ((ctx->rest & 0x80000000) == 0) {
    ctx->rest = (uint)((ctx->rest + size) % block_size_00);
    index = size;
    size_local = (size_t)msg;
    if (uVar1 != 0) {
      uVar2 = block_size_00 - uVar1;
      local_58 = uVar2;
      if (size < uVar2) {
        local_58 = size;
      }
      memcpy((void *)((long)ctx->message + uVar1),msg,local_58);
      if (size < uVar2) {
        return;
      }
      rhash_sha3_process_block(ctx->hash,ctx->message,block_size_00);
      size_local = (size_t)(msg + uVar2);
      index = size - uVar2;
    }
    for (; block_size_00 <= index; index = index - block_size_00) {
      if ((size_local & 7) == 0) {
        local_40 = (uint64_t *)size_local;
      }
      else {
        memcpy(ctx->message,(void *)size_local,block_size_00);
        local_40 = ctx->message;
      }
      rhash_sha3_process_block(ctx->hash,local_40,block_size_00);
      size_local = block_size_00 + size_local;
    }
    if (index != 0) {
      memcpy(ctx->message,(void *)size_local,index);
    }
  }
  return;
}

Assistant:

void rhash_sha3_update(sha3_ctx *ctx, const unsigned char *msg, size_t size)
{
	size_t index = (size_t)ctx->rest;
	size_t block_size = (size_t)ctx->block_size;

	if (ctx->rest & SHA3_FINALIZED) return; /* too late for additional input */
	ctx->rest = (unsigned)((ctx->rest + size) % block_size);

	/* fill partial block */
	if (index) {
		size_t left = block_size - index;
		memcpy((char*)ctx->message + index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_sha3_process_block(ctx->hash, ctx->message, block_size);
		msg  += left;
		size -= left;
	}
	while (size >= block_size) {
		uint64_t* aligned_message_block;
		if (IS_ALIGNED_64(msg)) {
			/* the most common case is processing of an already aligned message
			without copying it */
			aligned_message_block = (uint64_t*)msg;
		} else {
			memcpy(ctx->message, msg, block_size);
			aligned_message_block = ctx->message;
		}

		rhash_sha3_process_block(ctx->hash, aligned_message_block, block_size);
		msg  += block_size;
		size -= block_size;
	}
	if (size) {
		memcpy(ctx->message, msg, size); /* save leftovers */
	}
}